

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

TargetPropertyEntry *
CreateTargetPropertyEntry
          (string *propertyValue,cmListFileBacktrace *backtrace,bool evaluateForBuildsystem)

{
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  uVar1;
  size_type sVar2;
  TargetPropertyEntryString *this;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  undefined1 local_68 [16];
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_58;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_48;
  string local_40;
  
  sVar2 = cmGeneratorExpression::Find(propertyValue);
  if (sVar2 == 0xffffffffffffffff) {
    this = (TargetPropertyEntryString *)operator_new(0x50);
    std::__cxx11::string::string((string *)&local_40,(string *)propertyValue);
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
               backtrace);
    TargetPropertyEntryString::TargetPropertyEntryString
              (this,&local_40,(cmListFileBacktrace *)&local_58,
               &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    local_68._0_8_ =
         (backtrace->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68._8_8_ =
         (backtrace->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (backtrace->TopEntry).
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (backtrace->TopEntry).
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
    uVar1 = cge;
    *(bool *)((long)cge._M_t.
                    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
             0x168) = evaluateForBuildsystem;
    this = (TargetPropertyEntryString *)operator_new(0x28);
    cge._M_t.
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    (this->super_TargetPropertyEntry).LinkImplItem =
         &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
    (this->super_TargetPropertyEntry).Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->super_TargetPropertyEntry).Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_TargetPropertyEntry)._vptr_TargetPropertyEntry =
         (_func_int **)&PTR__TargetPropertyEntryGenex_00641c78;
    (this->PropertyValue)._M_dataplus._M_p =
         (pointer)uVar1._M_t.
                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
    local_48._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_48);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
  }
  return &this->super_TargetPropertyEntry;
}

Assistant:

cmGeneratorTarget::TargetPropertyEntry* CreateTargetPropertyEntry(
  const std::string& propertyValue,
  cmListFileBacktrace backtrace = cmListFileBacktrace(),
  bool evaluateForBuildsystem = false)
{
  if (cmGeneratorExpression::Find(propertyValue) != std::string::npos) {
    cmGeneratorExpression ge(std::move(backtrace));
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(propertyValue);
    cge->SetEvaluateForBuildsystem(evaluateForBuildsystem);
    return new TargetPropertyEntryGenex(std::move(cge));
  }

  return new TargetPropertyEntryString(propertyValue, backtrace);
}